

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O3

void cl_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  int iVar1;
  int64_t eval_b;
  int64_t eval_a;
  
  if (handle == &client || handle == &server) {
    if (flags != 0) goto LAB_001dda34;
    if (nread < 0) goto LAB_001dda41;
    if (nread == 0) {
      if (addr == (sockaddr *)0x0) {
        return;
      }
      goto LAB_001dda5d;
    }
    if (addr == (sockaddr *)0x0) goto LAB_001dda46;
    addr = (sockaddr *)0x4;
    if (nread != 4) goto LAB_001dda4b;
    iVar1 = bcmp("PONG",buf->base,4);
    if (iVar1 == 0) {
      cl_recv_cb_called = cl_recv_cb_called + 1;
      uv_close((uv_handle_t *)handle,close_cb);
      return;
    }
  }
  else {
    cl_recv_cb_cold_7();
LAB_001dda34:
    cl_recv_cb_cold_1();
LAB_001dda41:
    cl_recv_cb_cold_6();
LAB_001dda46:
    cl_recv_cb_cold_4();
LAB_001dda4b:
    cl_recv_cb_cold_2();
  }
  cl_recv_cb_cold_3();
LAB_001dda5d:
  cl_recv_cb_cold_5();
  iVar1 = uv_is_closing((uv_handle_t *)addr);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)addr,(uv_close_cb)0x0);
  return;
}

Assistant:

static void cl_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* buf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  CHECK_HANDLE(handle);
  ASSERT_OK(flags);
  ASSERT_EQ(nread, UV_ENOBUFS);

  cl_recv_cb_called++;

  uv_close((uv_handle_t*) handle, close_cb);
}